

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68020_cpgen(m68k_info *info)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint extension;
  uint uVar5;
  cs_m68k *pcVar6;
  ulong uVar7;
  anon_union_8_5_85a7a27f_for_cs_m68k_op_0 aVar8;
  long in_RDI;
  cs_m68k *ext_1;
  cs_m68k_op *op1_1;
  cs_m68k_op *op0_1;
  int opmode;
  int dst;
  int src;
  int rm;
  uint next;
  _Bool supports_single_op;
  cs_m68k_op *op1;
  cs_m68k_op *op0;
  cs_m68k *ext;
  m68k_info *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  m68k_info *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  uint uVar9;
  m68k_info *in_stack_ffffffffffffffc0;
  uint local_38;
  
  uVar9 = (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  if ((*(uint *)(in_RDI + 0x28) & 0x1c) == 0) {
    d68000_invalid((m68k_info *)0x384b83);
  }
  else {
    bVar1 = true;
    uVar2 = read_imm_16(in_stack_ffffffffffffffa0);
    uVar3 = uVar2 >> 0xe & 1;
    uVar4 = uVar2 >> 10 & 7;
    extension = uVar2 >> 7 & 7;
    local_38 = uVar2 & 0x3f;
    if (((*(uint *)(in_RDI + 0x24) & 0x3f) == 0) && ((uVar2 & 0xfc00) == 0x5c00)) {
      pcVar6 = build_init_op(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                             in_stack_ffffffffffffffa8,
                             (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
      pcVar6->operands[0].address_mode = M68K_AM_IMMEDIATE;
      pcVar6->operands[0].type = M68K_OP_IMM;
      aVar8.reg_pair.reg_1 = 0;
      aVar8.reg = uVar2 & 0x3f;
      pcVar6->operands[0].field_0 = aVar8;
      pcVar6->operands[1].field_0.reg = (uVar2 >> 7 & 7) + M68K_REG_FP0;
    }
    else {
      uVar5 = uVar2 >> 0xd & 7;
      if (uVar5 - 4 < 2) {
        fmove_fpcr(in_stack_ffffffffffffffc0,uVar9);
      }
      else if (uVar5 - 6 < 2) {
        fmovem((m68k_info *)(CONCAT44(uVar2 >> 0xe,uVar2 >> 10) & 0x100000007),extension);
      }
      else {
        if ((uVar2 >> 6 & 1) != 0) {
          local_38 = uVar2 & 0x3b;
        }
        uVar7 = (ulong)local_38;
        switch(uVar7) {
        case 0:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0xb0);
          bVar1 = false;
          break;
        case 1:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0xa9);
          break;
        case 2:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0xc4);
          break;
        case 3:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0xaa);
          break;
        case 4:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0xc5);
          break;
        default:
          break;
        case 6:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0xae);
          break;
        case 8:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0xa6);
          break;
        case 9:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0x5e);
          break;
        case 10:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0x5d);
          break;
        case 0xc:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0x5c);
          break;
        case 0xd:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0x5e);
          break;
        case 0xe:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0xc2);
          break;
        case 0xf:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0xeb);
          break;
        case 0x10:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0xa5);
          break;
        case 0x11:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0x10f);
          break;
        case 0x12:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0xed);
          break;
        case 0x14:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0xad);
          break;
        case 0x15:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0xab);
          break;
        case 0x16:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0xac);
          break;
        case 0x18:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0x55);
          break;
        case 0x19:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0x81);
          break;
        case 0x1a:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0xb8);
          break;
        case 0x1c:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0x58);
          break;
        case 0x1d:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0x80);
          break;
        case 0x1e:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0xa7);
          break;
        case 0x1f:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0xa8);
          break;
        case 0x20:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0xa2);
          bVar1 = false;
          break;
        case 0x21:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0xaf);
          bVar1 = false;
          break;
        case 0x22:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0x59);
          bVar1 = false;
          break;
        case 0x23:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0xb5);
          bVar1 = false;
          break;
        case 0x24:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0xc0);
          bVar1 = false;
          break;
        case 0x25:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0xbc);
          break;
        case 0x26:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0xbf);
          break;
        case 0x27:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0xc1);
          break;
        case 0x28:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0xe8);
          bVar1 = false;
          break;
        case 0x38:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0x7f);
          bVar1 = false;
          break;
        case 0x3a:
          MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),0x10e);
        }
        if ((uVar2 >> 6 & 1) != 0) {
          if ((uVar2 >> 2 & 1) == 0) {
            *(int *)(*(long *)(in_RDI + 0x18) + 8) = *(int *)(*(long *)(in_RDI + 0x18) + 8) + 1;
          }
          else {
            *(int *)(*(long *)(in_RDI + 0x18) + 8) = *(int *)(*(long *)(in_RDI + 0x18) + 8) + 2;
          }
        }
        *(undefined1 *)(in_RDI + 0x118) = 2;
        *(undefined4 *)(in_RDI + 0x110) = 1;
        *(undefined4 *)(in_RDI + 0x114) = 0;
        if (((uVar3 == 0) && (bVar1)) && (uVar4 == extension)) {
          *(undefined1 *)(in_RDI + 0x118) = 1;
          *(int *)(in_RDI + 0x30) = extension + 0x11;
        }
        else {
          if (uVar3 == 1) {
            uVar9 = (uint)uVar7;
            uVar2 = (uint)(uVar7 >> 0x20);
            switch(uVar4) {
            case 0:
              *(undefined4 *)(in_RDI + 0x114) = 4;
              get_ea_mode_op(in_stack_ffffffffffffffb0,
                             (cs_m68k_op *)CONCAT44(uVar5,in_stack_ffffffffffffffa8),uVar2,uVar9);
              break;
            case 1:
              *(undefined4 *)(in_RDI + 0x110) = 2;
              *(undefined4 *)(in_RDI + 0x114) = 4;
              get_ea_mode_op(in_stack_ffffffffffffffb0,
                             (cs_m68k_op *)CONCAT44(uVar5,in_stack_ffffffffffffffa8),uVar2,uVar9);
              *(undefined4 *)(in_RDI + 0x60) = 4;
              break;
            default:
              *(undefined4 *)(in_RDI + 0x110) = 2;
              *(undefined4 *)(in_RDI + 0x114) = 0xc;
              break;
            case 4:
              *(undefined4 *)(in_RDI + 0x114) = 2;
              get_ea_mode_op(in_stack_ffffffffffffffb0,
                             (cs_m68k_op *)CONCAT44(uVar5,in_stack_ffffffffffffffa8),uVar2,uVar9);
              break;
            case 5:
              *(undefined4 *)(in_RDI + 0x110) = 2;
              *(undefined4 *)(in_RDI + 0x114) = 8;
              get_ea_mode_op(in_stack_ffffffffffffffb0,
                             (cs_m68k_op *)CONCAT44(uVar5,in_stack_ffffffffffffffa8),uVar2,uVar9);
              *(undefined4 *)(in_RDI + 0x60) = 5;
              break;
            case 6:
              *(undefined4 *)(in_RDI + 0x114) = 1;
              get_ea_mode_op(in_stack_ffffffffffffffb0,
                             (cs_m68k_op *)CONCAT44(uVar5,in_stack_ffffffffffffffa8),uVar2,uVar9);
            }
          }
          else {
            *(int *)(in_RDI + 0x30) = uVar4 + 0x11;
          }
          *(uint *)(in_RDI + 0x68) = extension + 0x11;
        }
      }
    }
  }
  return;
}

Assistant:

static void d68020_cpgen(m68k_info *info)
{
	cs_m68k *ext;
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	bool supports_single_op;
	uint next;
	int rm, src, dst, opmode;


	LIMIT_CPU_TYPES(info, M68020_PLUS);

	supports_single_op = true;

	next = read_imm_16(info);

	rm = (next >> 14) & 0x1;
	src = (next >> 10) & 0x7;
	dst = (next >> 7) & 0x7;
	opmode = next & 0x3f;

	// special handling for fmovecr

	if (BITFIELD(info->ir, 5, 0) == 0 && BITFIELD(next, 15, 10) == 0x17) {
		cs_m68k_op* op0;
		cs_m68k_op* op1;
		cs_m68k* ext = build_init_op(info, M68K_INS_FMOVECR, 2, 0);

		op0 = &ext->operands[0];
		op1 = &ext->operands[1];

		op0->address_mode = M68K_AM_IMMEDIATE;
		op0->type = M68K_OP_IMM;
		op0->imm = next & 0x3f;

		op1->reg = M68K_REG_FP0 + ((next >> 7) & 7);

		return;
	}

	// deal with extended move stuff

	switch ((next >> 13) & 0x7) {
		// fmovem fpcr
		case 0x4:	// FMOVEM ea, FPCR
		case 0x5:	// FMOVEM FPCR, ea
			fmove_fpcr(info, next);
			return;

		// fmovem list
		case 0x6:
		case 0x7:
			fmovem(info, next);
			return;
	}

	// See comment bellow on why this is being done

	if ((next >> 6) & 1)
		opmode &= ~4;

	// special handling of some instructions here

	switch (opmode) {
		case 0x00: MCInst_setOpcode(info->inst, M68K_INS_FMOVE); supports_single_op = false; break;
		case 0x01: MCInst_setOpcode(info->inst, M68K_INS_FINT); break;
		case 0x02: MCInst_setOpcode(info->inst, M68K_INS_FSINH); break;
		case 0x03: MCInst_setOpcode(info->inst, M68K_INS_FINTRZ); break;
		case 0x04: MCInst_setOpcode(info->inst, M68K_INS_FSQRT); break;
		case 0x06: MCInst_setOpcode(info->inst, M68K_INS_FLOGNP1); break;
		case 0x08: MCInst_setOpcode(info->inst, M68K_INS_FETOXM1); break;
		case 0x09: MCInst_setOpcode(info->inst, M68K_INS_FATANH); break;
		case 0x0a: MCInst_setOpcode(info->inst, M68K_INS_FATAN); break;
		case 0x0c: MCInst_setOpcode(info->inst, M68K_INS_FASIN); break;
		case 0x0d: MCInst_setOpcode(info->inst, M68K_INS_FATANH); break;
		case 0x0e: MCInst_setOpcode(info->inst, M68K_INS_FSIN); break;
		case 0x0f: MCInst_setOpcode(info->inst, M68K_INS_FTAN); break;
		case 0x10: MCInst_setOpcode(info->inst, M68K_INS_FETOX); break;
		case 0x11: MCInst_setOpcode(info->inst, M68K_INS_FTWOTOX); break;
		case 0x12: MCInst_setOpcode(info->inst, M68K_INS_FTENTOX); break;
		case 0x14: MCInst_setOpcode(info->inst, M68K_INS_FLOGN); break;
		case 0x15: MCInst_setOpcode(info->inst, M68K_INS_FLOG10); break;
		case 0x16: MCInst_setOpcode(info->inst, M68K_INS_FLOG2); break;
		case 0x18: MCInst_setOpcode(info->inst, M68K_INS_FABS); break;
		case 0x19: MCInst_setOpcode(info->inst, M68K_INS_FCOSH); break;
		case 0x1a: MCInst_setOpcode(info->inst, M68K_INS_FNEG); break;
		case 0x1c: MCInst_setOpcode(info->inst, M68K_INS_FACOS); break;
		case 0x1d: MCInst_setOpcode(info->inst, M68K_INS_FCOS); break;
		case 0x1e: MCInst_setOpcode(info->inst, M68K_INS_FGETEXP); break;
		case 0x1f: MCInst_setOpcode(info->inst, M68K_INS_FGETMAN); break;
		case 0x20: MCInst_setOpcode(info->inst, M68K_INS_FDIV); supports_single_op = false; break;
		case 0x21: MCInst_setOpcode(info->inst, M68K_INS_FMOD); supports_single_op = false; break;
		case 0x22: MCInst_setOpcode(info->inst, M68K_INS_FADD); supports_single_op = false; break;
		case 0x23: MCInst_setOpcode(info->inst, M68K_INS_FMUL); supports_single_op = false; break;
		case 0x24: MCInst_setOpcode(info->inst, M68K_INS_FSGLDIV); supports_single_op = false; break;
		case 0x25: MCInst_setOpcode(info->inst, M68K_INS_FREM); break;
		case 0x26: MCInst_setOpcode(info->inst, M68K_INS_FSCALE); break;
		case 0x27: MCInst_setOpcode(info->inst, M68K_INS_FSGLMUL); break;
		case 0x28: MCInst_setOpcode(info->inst, M68K_INS_FSUB); supports_single_op = false; break;
		case 0x38: MCInst_setOpcode(info->inst, M68K_INS_FCMP); supports_single_op = false; break;
		case 0x3a: MCInst_setOpcode(info->inst, M68K_INS_FTST); break;
		default:
			break;
	}

	// Some trickery here! It's not documented but if bit 6 is set this is a s/d opcode and then
	// if bit 2 is set it's a d. As we already have set our opcode in the code above we can just
	// offset it as the following 2 op codes (if s/d is supported) will always be directly after it

	if ((next >> 6) & 1) {
		if ((next >> 2) & 1)
			info->inst->Opcode += 2;
		else
			info->inst->Opcode += 1;
	}

	ext = &info->extension;

	ext->op_count = 2;
	ext->op_size.type = M68K_SIZE_TYPE_CPU;
	ext->op_size.cpu_size = 0;

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	if (rm == 0 && supports_single_op && src == dst) {
		ext->op_count = 1;
		op0->reg = M68K_REG_FP0 + dst;
		return;
	}

	if (rm == 1) {
		switch (src) {
			case 0x00 :
				ext->op_size.cpu_size = M68K_CPU_SIZE_LONG;
				get_ea_mode_op(info, op0, info->ir, 4);
				break;

			case 0x06 :
				ext->op_size.cpu_size = M68K_CPU_SIZE_BYTE;
				get_ea_mode_op(info, op0, info->ir, 1);
				break;

			case 0x04 :
				ext->op_size.cpu_size = M68K_CPU_SIZE_WORD;
				get_ea_mode_op(info, op0, info->ir, 2);
				break;

			case 0x01 :
				ext->op_size.type = M68K_SIZE_TYPE_FPU;
				ext->op_size.fpu_size = M68K_FPU_SIZE_SINGLE;
				get_ea_mode_op(info, op0, info->ir, 4);
				op0->type = M68K_OP_FP_SINGLE;
				break;

			case 0x05:
				ext->op_size.type = M68K_SIZE_TYPE_FPU;
				ext->op_size.fpu_size = M68K_FPU_SIZE_DOUBLE;
				get_ea_mode_op(info, op0, info->ir, 8);
				op0->type = M68K_OP_FP_DOUBLE;
				break;

			default :
				ext->op_size.type = M68K_SIZE_TYPE_FPU;
				ext->op_size.fpu_size = M68K_FPU_SIZE_EXTENDED;
				break;
		}
	} else {
		op0->reg = M68K_REG_FP0 + src;
	}

	op1->reg = M68K_REG_FP0 + dst;
}